

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void EdgeDetectionHelper::find
               (EdgeDetectionBase<double> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  gradientType gVar4;
  uint32_t uVar5;
  uint uVar6;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *point;
  ulong uVar7;
  uchar *puVar8;
  uchar *sig;
  uint *puVar9;
  uint32_t rowId_1;
  uchar *puVar10;
  EVP_PKEY_CTX *ctx;
  ulong uVar11;
  ulong uVar12;
  pointer piVar13;
  undefined4 in_register_0000008c;
  size_t tbslen;
  uint32_t rowId;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  vector<double,_std::allocator<double>_> edgePositive;
  vector<double,_std::allocator<double>_> edgeNegative;
  vector<int,_std::allocator<int>_> secondDerivative;
  vector<int,_std::allocator<int>_> firstDerivative;
  vector<int,_std::allocator<int>_> data;
  
  auVar16 = in_ZMM1._0_16_;
  auVar15 = in_ZMM0._0_16_;
  tbslen = CONCAT44(in_register_0000008c,height);
  puVar8 = (uchar *)(ulong)height;
  uVar11 = (ulong)width;
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  ctx = (EVP_PKEY_CTX *)(ulong)x;
  uVar7 = uVar11;
  puVar10 = puVar8;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  EdgeParameter::verify(edgeParameter,ctx,sig,uVar7,puVar10,tbslen);
  uVar5 = height;
  if (edgeParameter->direction < TOP_TO_BOTTOM) {
    uVar5 = width;
  }
  if (3 < uVar5) {
    uVar1 = image->_rowSize;
    point = &edgeDetection->negativeEdgePoint;
    if (edgeParameter->direction < TOP_TO_BOTTOM) {
      std::vector<int,_std::allocator<int>_>::vector
                (&data,uVar11,(allocator_type *)&firstDerivative);
      secondDerivative.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&firstDerivative,uVar11,(value_type_conflict3 *)&secondDerivative,
                 (allocator_type *)&edgePositive);
      edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&secondDerivative,uVar11,(value_type_conflict3 *)&edgePositive,
                 (allocator_type *)&edgeNegative);
      uVar14 = 0;
      puVar10 = image->_data + (ulong)x + (ulong)(uVar1 * y);
      auVar15 = vcvtusi2sd_avx512f(auVar15,(x - 1) + width);
      auVar16 = vcvtusi2sd_avx512f(auVar16,x);
      for (; uVar14 < (height + 1) - edgeParameter->groupFactor;
          uVar14 = uVar14 + edgeParameter->skipFactor) {
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = (uint)puVar10[uVar7];
        }
        uVar6 = uVar1;
        for (uVar7 = 1; uVar7 < edgeParameter->groupFactor; uVar7 = uVar7 + 1) {
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar12] =
                 data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar12] + (uint)puVar10[uVar12 + uVar6];
          }
          uVar6 = uVar6 + uVar1;
        }
        edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        edgeNegative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        edgeNegative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        edgeNegative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        anon_unknown.dwarf_899df::findEdgePoints<double>
                  (&edgePositive,
                   (vector<double,_std::allocator<double>_> *)
                   &edgeNegative.super__Vector_base<double,_std::allocator<double>_>,&data,
                   &firstDerivative,&secondDerivative,edgeParameter,
                   edgeParameter->direction == LEFT_TO_RIGHT);
        gVar4 = edgeParameter->gradient;
        if (edgeParameter->direction == LEFT_TO_RIGHT) {
          if ((gVar4 | 2) == ANY) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createPositiveXEdge<double>
                      (&edgePositive,&edgeDetection->positiveEdgePoint,auVar16._0_8_,
                       (double)(auVar3._0_4_ * 0.5 + auVar2._0_4_));
            gVar4 = edgeParameter->gradient;
          }
          if (gVar4 - NEGATIVE < 2) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createNegativeXEdge<double>
                      ((vector<double,_std::allocator<double>_> *)
                       &edgeNegative.super__Vector_base<double,_std::allocator<double>_>,point,
                       auVar15._0_8_,(double)(auVar3._0_4_ * 0.5 + auVar2._0_4_));
          }
        }
        else {
          if ((gVar4 | 2) == ANY) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createNegativeXEdge<double>
                      ((vector<double,_std::allocator<double>_> *)
                       &edgeNegative.super__Vector_base<double,_std::allocator<double>_>,
                       &edgeDetection->positiveEdgePoint,auVar15._0_8_,
                       (double)(auVar3._0_4_ * 0.5 + auVar2._0_4_));
            gVar4 = edgeParameter->gradient;
          }
          if (gVar4 - NEGATIVE < 2) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createPositiveXEdge<double>
                      (&edgePositive,point,auVar16._0_8_,(double)(auVar3._0_4_ * 0.5 + auVar2._0_4_)
                      );
          }
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&edgeNegative.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&edgePositive.super__Vector_base<double,_std::allocator<double>_>);
        puVar10 = puVar10 + edgeParameter->skipFactor * uVar1;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&data,(size_type)puVar8,(allocator_type *)&firstDerivative);
      secondDerivative.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&firstDerivative,(size_type)puVar8,(value_type_conflict3 *)&secondDerivative,
                 (allocator_type *)&edgePositive);
      edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&secondDerivative,(size_type)puVar8,(value_type_conflict3 *)&edgePositive,
                 (allocator_type *)&edgeNegative);
      uVar14 = 0;
      auVar15 = vcvtusi2sd_avx512f(auVar15,(y - 1) + height);
      puVar10 = image->_data + (ulong)x + (ulong)(uVar1 * y);
      auVar16 = vcvtusi2sd_avx512f(auVar16,y);
      for (; uVar14 < (width + 1) - edgeParameter->groupFactor;
          uVar14 = uVar14 + edgeParameter->skipFactor) {
        puVar9 = (uint *)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        for (uVar7 = 0; uVar1 * height != uVar7; uVar7 = uVar7 + uVar1) {
          *puVar9 = (uint)puVar10[uVar7];
          puVar9 = puVar9 + 1;
        }
        puVar8 = puVar10;
        for (uVar7 = 1; puVar8 = puVar8 + 1, uVar7 < edgeParameter->groupFactor; uVar7 = uVar7 + 1)
        {
          piVar13 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar11 = 0; uVar1 * height != uVar11; uVar11 = uVar11 + uVar1) {
            *piVar13 = *piVar13 + (uint)puVar8[uVar11];
            piVar13 = piVar13 + 1;
          }
        }
        edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        edgeNegative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        edgePositive.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        edgeNegative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        edgeNegative.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        anon_unknown.dwarf_899df::findEdgePoints<double>
                  (&edgePositive,
                   (vector<double,_std::allocator<double>_> *)
                   &edgeNegative.super__Vector_base<double,_std::allocator<double>_>,&data,
                   &firstDerivative,&secondDerivative,edgeParameter,
                   edgeParameter->direction == TOP_TO_BOTTOM);
        gVar4 = edgeParameter->gradient;
        if (edgeParameter->direction == TOP_TO_BOTTOM) {
          if ((gVar4 | 2) == ANY) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createPositiveYEdge<double>
                      (&edgePositive,&edgeDetection->positiveEdgePoint,
                       (double)(auVar3._0_4_ * 0.5 + auVar2._0_4_),auVar16._0_8_);
            gVar4 = edgeParameter->gradient;
          }
          if (gVar4 - NEGATIVE < 2) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createNegativeYEdge<double>
                      ((vector<double,_std::allocator<double>_> *)
                       &edgeNegative.super__Vector_base<double,_std::allocator<double>_>,point,
                       (double)(auVar3._0_4_ * 0.5 + auVar2._0_4_),auVar15._0_8_);
          }
        }
        else {
          if ((gVar4 | 2) == ANY) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createNegativeYEdge<double>
                      ((vector<double,_std::allocator<double>_> *)
                       &edgeNegative.super__Vector_base<double,_std::allocator<double>_>,
                       &edgeDetection->positiveEdgePoint,(double)(auVar3._0_4_ * 0.5 + auVar2._0_4_)
                       ,auVar15._0_8_);
            gVar4 = edgeParameter->gradient;
          }
          if (gVar4 - NEGATIVE < 2) {
            auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar14);
            auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
            anon_unknown.dwarf_899df::createPositiveYEdge<double>
                      (&edgePositive,point,(double)(auVar3._0_4_ * 0.5 + auVar2._0_4_),auVar16._0_8_
                      );
          }
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&edgeNegative.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&edgePositive.super__Vector_base<double,_std::allocator<double>_>);
        puVar10 = puVar10 + edgeParameter->skipFactor;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&secondDerivative.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&firstDerivative.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&data.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<double> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}